

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImDrawList::PushTextureID(ImDrawList *this,ImTextureID texture_id)

{
  void **__src;
  int iVar1;
  void **__dest;
  int iVar2;
  int iVar3;
  
  iVar1 = (this->_TextureIdStack).Size;
  if (iVar1 == (this->_TextureIdStack).Capacity) {
    if (iVar1 == 0) {
      iVar2 = 8;
    }
    else {
      iVar2 = iVar1 / 2 + iVar1;
    }
    iVar3 = iVar1 + 1;
    if (iVar1 + 1 < iVar2) {
      iVar3 = iVar2;
    }
    __dest = (void **)ImGui::MemAlloc((long)iVar3 << 3);
    __src = (this->_TextureIdStack).Data;
    if (__src != (void **)0x0) {
      memcpy(__dest,__src,(long)(this->_TextureIdStack).Size << 3);
      ImGui::MemFree((this->_TextureIdStack).Data);
    }
    (this->_TextureIdStack).Data = __dest;
    (this->_TextureIdStack).Capacity = iVar3;
    iVar1 = (this->_TextureIdStack).Size;
  }
  else {
    __dest = (this->_TextureIdStack).Data;
  }
  __dest[iVar1] = texture_id;
  (this->_TextureIdStack).Size = (this->_TextureIdStack).Size + 1;
  (this->_CmdHeader).TextureId = texture_id;
  _OnChangedTextureID(this);
  return;
}

Assistant:

void ImDrawList::PushTextureID(ImTextureID texture_id)
{
    _TextureIdStack.push_back(texture_id);
    _CmdHeader.TextureId = texture_id;
    _OnChangedTextureID();
}